

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool sparc_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cs,CPUBreakpoint *bp)

{
  TCGContext_conflict8 *tcg_ctx;
  TCGTemp *local_18;
  
  tcg_ctx = *(TCGContext_conflict8 **)(dcbase[4].pc_next + 0x2e8);
  if (dcbase[1].tb != (TranslationBlock *)dcbase->pc_first) {
    save_state((DisasContext_conflict8 *)dcbase);
  }
  local_18 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  tcg_gen_callN_sparc64(tcg_ctx,helper_debug_sparc64,(TCGTemp *)0x0,1,&local_18);
  tcg_gen_exit_tb_sparc64(tcg_ctx,(TranslationBlock *)0x0,0);
  dcbase->is_jmp = DISAS_NORETURN;
  dcbase->pc_next = dcbase->pc_next + 4;
  return true;
}

Assistant:

static bool sparc_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cs,
                                      const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    if (dc->pc != dc->base.pc_first) {
        save_state(dc);
    }
    gen_helper_debug(tcg_ctx, tcg_ctx->cpu_env);
    tcg_gen_exit_tb(tcg_ctx, NULL, 0);
    dc->base.is_jmp = DISAS_NORETURN;
    /* update pc_next so that the current instruction is included in tb->size */
    dc->base.pc_next += 4;
    return true;
}